

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void * event_mm_calloc_(size_t count,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  int *piVar4;
  
  if (size != 0 && count != 0) {
    if (mm_malloc_fn_ == (_func_void_ptr_size_t *)0x0) {
      pvVar3 = calloc(count,size);
      return pvVar3;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = count;
    if (SUB168(auVar1 * auVar2,8) == 0) {
      pvVar3 = (*mm_malloc_fn_)(size * count);
      if (pvVar3 != (void *)0x0) {
        pvVar3 = memset(pvVar3,0,size * count);
        return pvVar3;
      }
    }
    piVar4 = __errno_location();
    *piVar4 = 0xc;
  }
  return (void *)0x0;
}

Assistant:

void *
event_mm_calloc_(size_t count, size_t size)
{
	if (count == 0 || size == 0)
		return NULL;

	if (mm_malloc_fn_) {
		size_t sz = count * size;
		void *p = NULL;
		if (count > EV_SIZE_MAX / size)
			goto error;
		p = mm_malloc_fn_(sz);
		if (p)
			return memset(p, 0, sz);
	} else {
		void *p = calloc(count, size);
#ifdef _WIN32
		/* Windows calloc doesn't reliably set ENOMEM */
		if (p == NULL)
			goto error;
#endif
		return p;
	}

error:
	errno = ENOMEM;
	return NULL;
}